

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error externalEntityInitProcessor3(XML_Parser parser,char *start,char *end,char **endPtr)

{
  bool bVar1;
  int iVar2;
  XML_Parsing XVar3;
  XML_Error XVar4;
  char *next;
  char *local_30;
  
  parser->m_eventPtr = start;
  local_30 = start;
  iVar2 = (*parser->m_encoding->scanners[1])(parser->m_encoding,start,end,&local_30);
  parser->m_eventEndPtr = local_30;
  if (iVar2 == -2) {
    XVar4 = XML_ERROR_PARTIAL_CHAR;
LAB_006e5904:
    if ((parser->m_parsingStatus).finalBuffer == '\0') {
      *endPtr = start;
      XVar4 = XML_ERROR_NONE;
    }
    return XVar4;
  }
  if (iVar2 == -1) {
    XVar4 = XML_ERROR_UNCLOSED_TOKEN;
    goto LAB_006e5904;
  }
  if (iVar2 != 0xc) goto LAB_006e58cc;
  XVar3 = processXmlDecl(parser,1,start,local_30);
  if (XVar3 == XML_INITIALIZED) {
    XVar3 = (parser->m_parsingStatus).parsing;
    if (XVar3 == XML_FINISHED) {
      XVar3 = 0x23;
      goto LAB_006e58c6;
    }
    if (XVar3 == XML_SUSPENDED) {
      *endPtr = local_30;
      XVar3 = XML_INITIALIZED;
      goto LAB_006e58c6;
    }
    bVar1 = true;
    start = local_30;
  }
  else {
LAB_006e58c6:
    bVar1 = false;
  }
  if (!bVar1) {
    return XVar3;
  }
LAB_006e58cc:
  parser->m_processor = externalEntityContentProcessor;
  parser->m_tagLevel = 1;
  XVar4 = externalEntityContentProcessor(parser,start,end,endPtr);
  return XVar4;
}

Assistant:

static enum XML_Error PTRCALL
externalEntityInitProcessor3(XML_Parser parser, const char *start,
                             const char *end, const char **endPtr) {
  int tok;
  const char *next = start; /* XmlContentTok doesn't always set the last arg */
  parser->m_eventPtr = start;
  tok = XmlContentTok(parser->m_encoding, start, end, &next);
  /* Note: These bytes are accounted later in:
           - processXmlDecl
           - externalEntityContentProcessor
  */
  parser->m_eventEndPtr = next;

  switch (tok) {
  case XML_TOK_XML_DECL: {
    enum XML_Error result;
    result = processXmlDecl(parser, 1, start, next);
    if (result != XML_ERROR_NONE)
      return result;
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      *endPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default:
      start = next;
    }
  } break;
  case XML_TOK_PARTIAL:
    if (! parser->m_parsingStatus.finalBuffer) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    return XML_ERROR_UNCLOSED_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (! parser->m_parsingStatus.finalBuffer) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    return XML_ERROR_PARTIAL_CHAR;
  }
  parser->m_processor = externalEntityContentProcessor;
  parser->m_tagLevel = 1;
  return externalEntityContentProcessor(parser, start, end, endPtr);
}